

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

printer * __thiscall boost::ext::ut::v1_1_8::printer::operator<<(printer *this,char **t)

{
  char *pcVar1;
  printer *in_RDI;
  
  pcVar1 = detail::get<char_const*>((char **)0x11350f);
  std::operator<<((ostream *)&in_RDI->field_0x40,pcVar1);
  return in_RDI;
}

Assistant:

auto& operator<<(const T& t) {
      out_ << detail::get(t);
      return *this;
    }